

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O1

void PushExpression(s_assenv *ae,int iw,e_expression zetype)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  s_wordlist *psVar6;
  int in_R9D;
  s_expression curexp;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  s_wordlist local_48;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_48.e = 0;
  local_48.ifile = 0;
  uStack_30 = 0;
  local_48.w = (char *)0x0;
  local_48.l = 0;
  local_48.t = 0;
  local_28 = 0;
  if (ae->nocode != 0) {
    if (zetype < (E_EXPRESSION_IM|E_EXPRESSION_0V8)) {
      iVar2 = *(int *)(&DAT_00141270 + (ulong)zetype * 4);
      ae->outputadr = ae->outputadr + iVar2;
      ae->codeadr = ae->codeadr + iVar2;
    }
    uVar4 = ae->maxptr;
    if (ae->outputadr <= (int)uVar4) {
      return;
    }
    pcVar3 = GetCurrentFile(ae);
    uVar1 = ae->wl[ae->idx].l;
    pcVar5 = "[%s:%d] NOCODE output exceed limit %d\n";
    goto LAB_0011ba44;
  }
  local_48.t = 0;
  local_48.l = iw;
  local_48._16_8_ = (ulong)(uint)ae->outputadr << 0x20;
  local_28 = CONCAT44(ae->io + -1,ae->activebank);
  uStack_30 = CONCAT44(ae->lz,zetype);
  psVar6 = ae->wl;
  if (psVar6[iw].e == 0) {
    iVar2 = 0;
    if (zetype < (E_EXPRESSION_IM|E_EXPRESSION_0V8)) {
      iVar2 = *(int *)(&DAT_0014123c + (ulong)zetype * 4);
    }
    ae->codeadr = ae->codeadr + iVar2;
    if (((ae->ir == 0) && (ae->iw == 0)) && (ae->imacro == 0)) {
      psVar6 = psVar6 + iw;
    }
    else {
      local_48.w = strdup(psVar6[iw].w);
      psVar6 = &local_48;
    }
    ExpressionFastTranslate(ae,&psVar6->w,1);
    ae->codeadr = ae->codeadr - iVar2;
  }
  switch(zetype) {
  case E_EXPRESSION_J8:
  case E_EXPRESSION_V8:
  case E_EXPRESSION_IM:
    iVar2 = ae->codeadr;
    local_48.e = iVar2 + -1;
    goto LAB_0011b9c9;
  case E_EXPRESSION_0V8:
  case E_EXPRESSION_RST:
    local_48.e = ae->codeadr;
    ae->outputadr = ae->outputadr + 1;
    iVar2 = ae->codeadr + 1;
    break;
  case E_EXPRESSION_V16:
    iVar2 = ae->codeadr;
    local_48.e = iVar2 + -1;
    goto LAB_0011b97e;
  case E_EXPRESSION_0V16:
    local_48.e = ae->codeadr;
    ae->outputadr = ae->outputadr + 2;
    iVar2 = ae->codeadr + 2;
    break;
  case E_EXPRESSION_0V32:
    local_48.e = ae->codeadr;
    ae->outputadr = ae->outputadr + 4;
    iVar2 = ae->codeadr + 4;
    break;
  case E_EXPRESSION_0VR:
    local_48.e = ae->codeadr;
    ae->outputadr = ae->outputadr + 5;
    iVar2 = ae->codeadr + 5;
    break;
  case E_EXPRESSION_IV8:
  case E_EXPRESSION_IV81:
    iVar2 = ae->codeadr;
    local_48.e = iVar2 + -2;
    goto LAB_0011b9c9;
  case E_EXPRESSION_3V8:
    iVar2 = ae->codeadr;
    local_48.e = iVar2 + -3;
LAB_0011b9c9:
    ae->outputadr = ae->outputadr + 1;
    iVar2 = iVar2 + 1;
LAB_0011b9d5:
    ae->codeadr = iVar2;
    goto switchD_0011b922_default;
  case E_EXPRESSION_IV16:
    iVar2 = ae->codeadr;
    local_48.e = iVar2 + -2;
LAB_0011b97e:
    ae->outputadr = ae->outputadr + 2;
    iVar2 = iVar2 + 2;
    goto LAB_0011b9d5;
  default:
    goto switchD_0011b922_default;
  }
  ae->codeadr = iVar2;
switchD_0011b922_default:
  uVar4 = ae->maxptr;
  if (ae->outputadr <= (int)uVar4) {
    _internal_ObjectArrayAddDynamicValueConcat
              (&ae->expression,&ae->ie,&ae->me,&local_48,0x28,in_R9D,in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffb0);
    return;
  }
  pcVar3 = GetCurrentFile(ae);
  uVar1 = ae->wl[ae->idx].l;
  pcVar5 = "[%s:%d] output exceed limit %d\n";
LAB_0011ba44:
  rasm_printf(ae,pcVar5,pcVar3,(ulong)uVar1,(ulong)uVar4);
  FreeAssenv(ae);
  exit(3);
}

Assistant:

void PushExpression(struct s_assenv *ae,int iw,enum e_expression zetype)
{
	#undef FUNC
	#define FUNC "PushExpression"
	
	struct s_expression curexp={0};
	int startptr=0;

	if (!ae->nocode) {
		curexp.iw=iw;
		curexp.wptr=ae->outputadr;
		curexp.zetype=zetype;
		curexp.ibank=ae->activebank;
		curexp.iorgzone=ae->io-1;
		curexp.lz=ae->lz;
		/* on traduit de suite les variables du dictionnaire pour les boucles et increments
			SAUF si c'est une affectation */
		if (!ae->wl[iw].e) {
			switch (zetype) {
				case E_EXPRESSION_J8:
				case E_EXPRESSION_V8:
				case E_EXPRESSION_V16:
				case E_EXPRESSION_IM:startptr=-1;
							break;
				case E_EXPRESSION_IV8:
				case E_EXPRESSION_IV81:
				case E_EXPRESSION_IV16:startptr=-2;
							break;
				case E_EXPRESSION_3V8:startptr=-3;
							break;
				default:break;
			}
			/* hack pourri pour g�rer le $ */
			ae->codeadr+=startptr;
			/* ok mais les labels locaux des macros? */
			if (ae->ir || ae->iw || ae->imacro) {
				curexp.reference=TxtStrDup(ae->wl[iw].w);
				ExpressionFastTranslate(ae,&curexp.reference,1);
			} else {
				ExpressionFastTranslate(ae,&ae->wl[iw].w,1);
			}
			ae->codeadr-=startptr;
		}
		/* calcul adresse de reference et post-incrementation pour sauter les data */
		switch (zetype) {
			case E_EXPRESSION_J8:curexp.ptr=ae->codeadr-1;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_0V8:curexp.ptr=ae->codeadr;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_V8:curexp.ptr=ae->codeadr-1;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_0V16:curexp.ptr=ae->codeadr;ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_0V32:curexp.ptr=ae->codeadr;ae->outputadr+=4;ae->codeadr+=4;break;
			case E_EXPRESSION_0VR:curexp.ptr=ae->codeadr;ae->outputadr+=5;ae->codeadr+=5;break;
			case E_EXPRESSION_V16:curexp.ptr=ae->codeadr-1;ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_IV81:curexp.ptr=ae->codeadr-2;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IV8:curexp.ptr=ae->codeadr-2;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_3V8:curexp.ptr=ae->codeadr-3;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IV16:curexp.ptr=ae->codeadr-2;ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_RST:curexp.ptr=ae->codeadr;ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IM:curexp.ptr=ae->codeadr-1;ae->outputadr++;ae->codeadr++;break;
		}
		if (ae->outputadr<=ae->maxptr) {
			ObjectArrayAddDynamicValueConcat((void **)&ae->expression,&ae->ie,&ae->me,&curexp,sizeof(curexp));
		} else {
			rasm_printf(ae,"[%s:%d] output exceed limit %d\n",GetCurrentFile(ae),ae->wl[ae->idx].l,ae->maxptr);
			FreeAssenv(ae);exit(3);
		}
	} else {
		switch (zetype) {
			case E_EXPRESSION_J8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_0V8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_V8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_0V16:ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_0V32:ae->outputadr+=4;ae->codeadr+=4;break;
			case E_EXPRESSION_0VR:ae->outputadr+=5;ae->codeadr+=5;break;
			case E_EXPRESSION_V16:ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_IV81:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IV8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_3V8:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IV16:ae->outputadr+=2;ae->codeadr+=2;break;
			case E_EXPRESSION_RST:ae->outputadr++;ae->codeadr++;break;
			case E_EXPRESSION_IM:ae->outputadr++;ae->codeadr++;break;
		}
		if (ae->outputadr<=ae->maxptr) {
		} else {
			rasm_printf(ae,"[%s:%d] NOCODE output exceed limit %d\n",GetCurrentFile(ae),ae->wl[ae->idx].l,ae->maxptr);
			FreeAssenv(ae);exit(3);
		}
	}
}